

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_print_option(FILE *fp,char *shortopts,char *longopts,char *datatype,char *suffix)

{
  char *local_100;
  char local_f8 [8];
  char syntax [200];
  char *suffix_local;
  char *datatype_local;
  char *longopts_local;
  char *shortopts_local;
  FILE *fp_local;
  
  syntax._192_8_ = suffix;
  memset(local_f8,0,200);
  if (syntax._192_8_ == 0) {
    local_100 = "";
  }
  else {
    local_100 = (char *)syntax._192_8_;
  }
  syntax._192_8_ = local_100;
  arg_cat_optionv(local_f8,200,shortopts,longopts,datatype,0,"|");
  fputs(local_f8,(FILE *)fp);
  fputs((char *)syntax._192_8_,(FILE *)fp);
  return;
}

Assistant:

void arg_print_option(FILE * fp,
					  const char * shortopts,
					  const char * longopts,
					  const char * datatype,
					  const char * suffix) {
	char syntax[200] = "";
	suffix = suffix ? suffix : "";

	/* there is no way of passing the proper optvalue for optional argument values here, so we must ignore it */
	arg_cat_optionv(syntax,
					sizeof(syntax),
					shortopts,
					longopts,
					datatype,
					0,
					"|");

	fputs(syntax, fp);
	fputs(suffix, fp);
}